

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O3

void presolve::dev_kkt_check::checkStationarityOfLagrangian
               (State *state,KktConditionDetails *details)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  details->type = kStationarityOfLagrangian;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  details->checked = 0;
  details->violated = 0;
  if (0 < state->numCol) {
    iVar4 = 0;
    lVar8 = 0;
    do {
      if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar8] != 0) {
        details->checked = details->checked + 1;
        dVar1 = (state->colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        dVar11 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
        dVar10 = dVar1 - dVar11;
        dVar1 = (-dVar11 - (dVar10 - dVar1)) + (dVar1 - (dVar10 - (dVar10 - dVar1))) + 0.0;
        iVar2 = (state->Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        lVar6 = (long)iVar2;
        iVar3 = (state->Aend->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        if (iVar2 < iVar3) {
          dVar11 = dVar10;
          do {
            iVar2 = (state->Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar6];
            dVar10 = dVar11;
            if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar2] != 0) {
              dVar9 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar2] *
                      (state->Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6];
              dVar10 = dVar11 - dVar9;
              dVar1 = dVar1 + (-dVar9 - (dVar10 - dVar11)) + (dVar11 - (dVar10 - (dVar10 - dVar11)))
              ;
            }
            lVar6 = lVar6 + 1;
            dVar11 = dVar10;
          } while (iVar3 != lVar6);
        }
        dVar10 = dVar10 + dVar1;
        dVar1 = ABS(dVar10);
        if (1e-07 < dVar1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Column ",7);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," fails stationary of Lagrangian: dL/dx",0x26);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
          poVar5 = std::ostream::_M_insert<double>(dVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", rather than zero.",0x13);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          iVar4 = details->violated + 1;
          details->violated = iVar4;
          details->sum_violation_2 = dVar10 * dVar10 + details->sum_violation_2;
          if (details->max_violation <= dVar1 && dVar1 != details->max_violation) {
            details->max_violation = dVar1;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < state->numCol);
    if (iVar4 != 0) {
      pcVar7 = "KKT check error: Lagrangian is not stationary.\n";
      lVar8 = 0x2f;
      goto LAB_003690d6;
    }
  }
  pcVar7 = "Stationarity of Lagrangian.\n";
  lVar8 = 0x1c;
LAB_003690d6:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar8);
  return;
}

Assistant:

void checkStationarityOfLagrangian(const State& state,
                                   KktConditionDetails& details) {
  details.type = KktCondition::kStationarityOfLagrangian;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // A'y + c - z = 0
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;

      HighsCDouble lagrV = HighsCDouble(state.colCost[j]) - state.colDual[j];
      for (int k = state.Astart[j]; k < state.Aend[j]; k++) {
        const int row = state.Aindex[k];
        assert(row >= 0 && row < state.numRow);
        if (state.flagRow[row])
          lagrV = lagrV - state.rowDual[row] * state.Avalue[k];
      }

      if (fabs(double(lagrV)) > tol) {
        if (dev_print == 1)
          std::cout << "Column " << j
                    << " fails stationary of Lagrangian: dL/dx" << j << " = "
                    << double(lagrV) << ", rather than zero." << std::endl;
        infeas = fabs(double(lagrV));
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Stationarity of Lagrangian.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Lagrangian is not stationary.\n";
  }
}